

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateDeclarations
          (ServiceGenerator *this,Printer *printer)

{
  long lVar1;
  allocator<char> local_21a;
  allocator<char> local_219;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  Printer *printer_local;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
  vars;
  undefined1 local_1a0 [64];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  printer_local = printer;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (&vars,printer,&this->vars_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"virts",&local_219);
  local_1a0._0_8_ = local_1a0 + 0x10;
  if (local_1f8 == local_1e8) {
    local_1a0._24_8_ = uStack_1e0;
  }
  else {
    local_1a0._0_8_ = local_1f8;
  }
  local_1a0._8_8_ = local_1f0;
  local_1f0 = 0;
  local_1e8[0] = 0;
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1f8 = local_1e8;
  local_1d8._M_unused._M_object = operator_new(0x18);
  *(ServiceGenerator **)local_1d8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_1d8._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1d8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1c0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_1a0 + 0x20),
             (function<bool_()> *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"impls",&local_21a);
  local_e8 = local_d8;
  if (local_218 == local_208) {
    uStack_d0 = uStack_200;
  }
  else {
    local_e8 = local_218;
  }
  local_e0 = local_210;
  local_210 = 0;
  local_208[0] = 0;
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_218 = local_208;
  local_1d8._M_unused._M_object = operator_new(0x18);
  *(ServiceGenerator **)local_1d8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_1d8._M_unused._0_8_ + 8) = &printer_local;
  *(code *)((long)local_1d8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_1c0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(printer,local_1a0,2,0x85b,
                    "\n        class $classname$_Stub;\n        class $dllexport_decl $$classname$ : public $pb$::Service {\n         protected:\n          $classname$() = default;\n\n         public:\n          using Stub = $classname$_Stub;\n\n          $classname$(const $classname$&) = delete;\n          $classname$& operator=(const $classname$&) = delete;\n          virtual ~$classname$() = default;\n\n          static const $pb$::ServiceDescriptor* $nonnull$ descriptor();\n\n          $virts$;\n\n          // implements Service ----------------------------------------------\n          const $pb$::ServiceDescriptor* $nonnull$ GetDescriptor() override;\n\n          void CallMethod(\n              //~\n              const $pb$::MethodDescriptor* $nonnull$ method,\n              $pb$::RpcController* $nullable$ controller,\n              const $pb$::Message* $nonnull$ request,\n              $pb$::Message* $nonnull$ response,\n              ::google::protobuf::Closure* $nullable$ done) override;\n\n          const $pb$::Message& GetRequestPrototype(\n              const $pb$::MethodDescriptor* $nonnull$ method) const override;\n\n          const $pb$::Message& GetResponsePrototype(\n              const $pb$::MethodDescriptor* $nonnull$ method) const override;\n        };\n\n        class $dllexport_decl $$classname$_Stub final : public $classname$ {\n         public:\n          //~ It seems like channel should be nonnull, but some tests use\n          //~ nullptr. TODO: clean up and switch to nonnull.\n          $classname$_Stub($pb$::RpcChannel* $nullable$ channel);\n          $classname$_Stub($pb$::RpcChannel* $nullable$ channel,\n                           $pb$::Service::ChannelOwnership ownership);\n\n          $classname$_Stub(const $classname$_Stub&) = delete;\n          $classname$_Stub& operator=(const $classname$_Stub&) = delete;\n\n          ~$classname$_Stub() override;\n\n          inline $pb$::RpcChannel* $nullable$ channel() { return channel_; }\n\n          // implements $classname$ ------------------------------------------\n          $impls$;\n\n         private:\n     ..." /* TRUNCATED STRING LITERAL */
                   );
  lVar1 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_1a0 + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1025:28)>
  ::~Cleanup(&vars);
  return;
}

Assistant:

void ServiceGenerator::GenerateDeclarations(io::Printer* printer) {
  auto vars = printer->WithVars(&vars_);
  printer->Emit(
      {
          {"virts", [&] { GenerateMethodSignatures(kVirtual, printer); }},
          {"impls", [&] { GenerateMethodSignatures(kNonVirtual, printer); }},
      },
      R"cc(
        class $classname$_Stub;
        class $dllexport_decl $$classname$ : public $pb$::Service {
         protected:
          $classname$() = default;

         public:
          using Stub = $classname$_Stub;

          $classname$(const $classname$&) = delete;
          $classname$& operator=(const $classname$&) = delete;
          virtual ~$classname$() = default;

          static const $pb$::ServiceDescriptor* $nonnull$ descriptor();

          $virts$;

          // implements Service ----------------------------------------------
          const $pb$::ServiceDescriptor* $nonnull$ GetDescriptor() override;

          void CallMethod(
              //~
              const $pb$::MethodDescriptor* $nonnull$ method,
              $pb$::RpcController* $nullable$ controller,
              const $pb$::Message* $nonnull$ request,
              $pb$::Message* $nonnull$ response,
              ::google::protobuf::Closure* $nullable$ done) override;

          const $pb$::Message& GetRequestPrototype(
              const $pb$::MethodDescriptor* $nonnull$ method) const override;

          const $pb$::Message& GetResponsePrototype(
              const $pb$::MethodDescriptor* $nonnull$ method) const override;
        };

        class $dllexport_decl $$classname$_Stub final : public $classname$ {
         public:
          //~ It seems like channel should be nonnull, but some tests use
          //~ nullptr. TODO: clean up and switch to nonnull.
          $classname$_Stub($pb$::RpcChannel* $nullable$ channel);
          $classname$_Stub($pb$::RpcChannel* $nullable$ channel,
                           $pb$::Service::ChannelOwnership ownership);

          $classname$_Stub(const $classname$_Stub&) = delete;
          $classname$_Stub& operator=(const $classname$_Stub&) = delete;

          ~$classname$_Stub() override;

          inline $pb$::RpcChannel* $nullable$ channel() { return channel_; }

          // implements $classname$ ------------------------------------------
          $impls$;

         private:
          $pb$::RpcChannel* $nullable$ channel_;
          bool owns_channel_;
        };
      )cc");
}